

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
clean(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
      *this,Lit *idx)

{
  Watcher *pWVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  vec<Glucose::Solver::Watcher> *this_00;
  
  this_00 = (this->occs).data + idx->x;
  iVar2 = 0;
  for (lVar4 = 0; lVar4 < this_00->sz; lVar4 = lVar4 + 1) {
    pWVar1 = this_00->data;
    if (((((this->deleted).ca)->super_RegionAllocator<unsigned_int>).memory[pWVar1[lVar4].cref] & 3)
        != 1) {
      lVar3 = (long)iVar2;
      iVar2 = iVar2 + 1;
      pWVar1[lVar3] = pWVar1[lVar4];
    }
  }
  vec<Glucose::Solver::Watcher>::shrink(this_00,(int)lVar4 - iVar2);
  (this->dirty).data[idx->x] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}